

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O2

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::~CircularArray(CircularArray<wabt::Token,_2UL> *this)

{
  clear(this);
  std::array<wabt::Token,_2UL>::~array(&this->contents_);
  return;
}

Assistant:

~CircularArray() { clear(); }